

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.h
# Opt level: O2

void __thiscall
llvm::dwarf::CFIProgram::addInstruction
          (CFIProgram *this,uint8_t Opcode,uint64_t Operand1,uint64_t Operand2)

{
  Instruction local_78;
  uint64_t local_28;
  uint64_t Operand1_local;
  uint64_t Operand2_local;
  
  local_78.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.BeginX =
       &local_78.Ops.super_SmallVectorStorage<unsigned_long,_2U>;
  local_78.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Size = 0;
  local_78.Ops.super_SmallVectorImpl<unsigned_long>.
  super_SmallVectorTemplateBase<unsigned_long,_true>.
  super_SmallVectorTemplateCommon<unsigned_long,_void>.super_SmallVectorBase.Capacity = 2;
  local_78.Expression.Storage.field_0.empty = '\0';
  local_78.Expression.Storage.hasVal = false;
  local_78.Opcode = Opcode;
  local_28 = Operand1;
  Operand1_local = Operand2;
  std::
  vector<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
  ::emplace_back<llvm::dwarf::CFIProgram::Instruction>(&this->Instructions,&local_78);
  SmallVectorImpl<unsigned_long>::~SmallVectorImpl
            (&local_78.Ops.super_SmallVectorImpl<unsigned_long>);
  SmallVectorTemplateBase<unsigned_long,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_long,_true> *)
             &(this->Instructions).
              super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].Ops,&local_28);
  SmallVectorTemplateBase<unsigned_long,_true>::push_back
            ((SmallVectorTemplateBase<unsigned_long,_true> *)
             &(this->Instructions).
              super__Vector_base<llvm::dwarf::CFIProgram::Instruction,_std::allocator<llvm::dwarf::CFIProgram::Instruction>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].Ops,&Operand1_local);
  return;
}

Assistant:

void addInstruction(uint8_t Opcode, uint64_t Operand1, uint64_t Operand2) {
    Instructions.push_back(Instruction(Opcode));
    Instructions.back().Ops.push_back(Operand1);
    Instructions.back().Ops.push_back(Operand2);
  }